

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O0

uint get_memory(uint len,int type,uchar mid)

{
  uint uVar1;
  MemoryNode *pMVar2;
  MemoryNode *pMVar3;
  MemoryNode *pMVar4;
  MemoryNode *p_next;
  MemoryNode *p_forword;
  MemoryNode *used_node;
  MemoryNode *new_used;
  uint adr;
  MemoryNode *p;
  MemoryNode *free_head;
  MemoryNode *used_head;
  uint uStack_10;
  uchar mid_local;
  int type_local;
  uint len_local;
  
  free_head = (MemoryNode *)0x0;
  p = (MemoryNode *)0x0;
  if (len == 0) {
    type_local = -1;
  }
  else {
    used_head._3_1_ = mid;
    used_head._4_4_ = type;
    uStack_10 = len;
    init_get_head(type,&p,&free_head);
    pMVar2 = find_memory(uStack_10,p);
    if (pMVar2 == (MemoryNode *)0x0) {
      type_local = -1;
    }
    else {
      uVar1 = pMVar2->address;
      pMVar3 = (MemoryNode *)operator_new(0x20);
      pMVar3->address = pMVar2->address;
      pMVar3->size = uStack_10;
      pMVar3->mid = used_head._3_1_;
      pMVar4 = find_last_node(free_head);
      pMVar4->next = pMVar3;
      pMVar3->forward = pMVar4;
      pMVar3->next = (MemoryNode *)0x0;
      type_local = uVar1;
      if (pMVar2->size == uStack_10) {
        pMVar3 = pMVar2->forward;
        pMVar2 = pMVar2->next;
        pMVar3->next = pMVar2;
        pMVar2->forward = pMVar3;
      }
      else {
        pMVar2->address = uStack_10 + pMVar2->address;
        pMVar2->size = pMVar2->size - uStack_10;
      }
    }
  }
  return type_local;
}

Assistant:

EXPORT unsigned get_memory(unsigned len, int type,unsigned char mid) {
	MemoryNode *used_head = nullptr,*free_head = nullptr;
	if (!len) return-1;
	init_get_head(type, free_head, used_head);
	MemoryNode* p = find_memory(len,free_head);
	if (p != nullptr) {
		/*创建新的节点并把节点插入使用的最后*/
		unsigned adr = p->address;
		MemoryNode* new_used = new MemoryNode;
		new_used->address = p->address;
		new_used->size = len;
		new_used->mid = mid;
		MemoryNode* used_node = find_last_node(used_head);
		used_node->next = new_used;
		new_used->forward = used_node;
		new_used->next = nullptr;
		/*空闲块地址加 大小减小*/
		if (p->size == len) { //大小相等则取下节点
			MemoryNode *p_forword = p->forward;
			MemoryNode *p_next = p->next;
			p_forword->next = p_next;
			p_next->forward = p_forword;
		}
		else {
			p->address += len;
			p->size -= len;
		}
		return adr;
	}else return -1;
}